

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall
Fl_Input_Choice::Fl_Input_Choice(Fl_Input_Choice *this,int X,int Y,int W,int H,char *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Input *this_00;
  Fl_Menu_Button *this_01;
  
  Fl_Widget::Fl_Widget((Fl_Widget *)this,X,Y,W,H,L);
  (this->super_Fl_Group).children_ = 0;
  (this->super_Fl_Group).array_ = (Fl_Widget **)0x0;
  (this->super_Fl_Group).savedfocus_ = (Fl_Widget *)0x0;
  (this->super_Fl_Group).resizable_ = (Fl_Widget *)this;
  (this->super_Fl_Group).sizes_ = (int *)0x0;
  Fl_Group::current_ = &this->super_Fl_Group;
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Group_00277698;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\x03';
  (this->super_Fl_Group).super_Fl_Widget.label_.align_ = 4;
  this_00 = (Fl_Input *)operator_new(200);
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar5 = Fl::box_dx(FL_DOWN_BOX);
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar7 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar8 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  Fl_Input::Fl_Input(this_00,iVar5 + iVar1,iVar6 + iVar2,(iVar3 - iVar7) + -0x14,iVar4 - iVar8,
                     (char *)0x0);
  this->inp_ = this_00;
  (this_00->super_Fl_Input_).super_Fl_Widget.callback_ = inp_cb;
  (this_00->super_Fl_Input_).super_Fl_Widget.user_data_ = this;
  (this_00->super_Fl_Input_).super_Fl_Widget.box_ = '\x01';
  (this_00->super_Fl_Input_).super_Fl_Widget.when_ = '\x03';
  this_01 = (Fl_Menu_Button *)operator_new(0x98);
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar7 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  Fl_Menu_Button::Fl_Menu_Button
            (this_01,((iVar1 + iVar2) - iVar5) + -0x14,iVar6 + iVar3,0x14,iVar4 - iVar7,(char *)0x0)
  ;
  (this_01->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Menu__00277788;
  this->menu_ = (InputMenuButton *)this_01;
  (this_01->super_Fl_Menu_).super_Fl_Widget.callback_ = menu_cb;
  (this_01->super_Fl_Menu_).super_Fl_Widget.user_data_ = this;
  (this_01->super_Fl_Menu_).super_Fl_Widget.box_ = '\x01';
  Fl_Group::current_ = (this->super_Fl_Group).super_Fl_Widget.parent_;
  return;
}

Assistant:

Fl_Input_Choice::Fl_Input_Choice (int X,int Y,int W,int H,const char*L) 
: Fl_Group(X,Y,W,H,L) 
{
  Fl_Group::box(FL_DOWN_BOX);
  align(FL_ALIGN_LEFT);				// default like Fl_Input
  inp_ = new Fl_Input(inp_x(), inp_y(),
                      inp_w(), inp_h());
  inp_->callback(inp_cb, (void*)this);
  inp_->box(FL_FLAT_BOX);		// cosmetic
  inp_->when(FL_WHEN_CHANGED|FL_WHEN_NOT_CHANGED);
  menu_ = new InputMenuButton(menu_x(), menu_y(),
                              menu_w(), menu_h());
  menu_->callback(menu_cb, (void*)this);
  menu_->box(FL_FLAT_BOX);				// cosmetic
  end();
}